

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetLatencySampleName
          (VClient *this,uint i_SampleIndex,string *o_rSampleName)

{
  bool bVar1;
  Enum EVar2;
  ulong uVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  local_2c = Success;
  ClientUtils::Clear(o_rSampleName);
  bVar1 = InitGet(this,&local_2c);
  EVar2 = local_2c;
  if ((bVar1) &&
     (uVar3 = ((long)(this->m_LatestFrame).m_Latency.m_Samples.
                     super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_LatestFrame).m_Latency.m_Samples.
                     super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
     EVar2 = InvalidIndex, i_SampleIndex <= uVar3 && uVar3 - i_SampleIndex != 0)) {
    std::__cxx11::string::_M_assign((string *)o_rSampleName);
    EVar2 = Success;
  }
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar2;
}

Assistant:

Result::Enum VClient::GetLatencySampleName( const unsigned int i_SampleIndex, std::string & o_rSampleName ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rSampleName ) )
  {
    return GetResult; 
  }

  if( i_SampleIndex >= m_LatestFrame.m_Latency.m_Samples.size() )
  {
    return Result::InvalidIndex;
  }

  o_rSampleName = m_LatestFrame.m_Latency.m_Samples[ i_SampleIndex ].m_Name;

  return Result::Success;
}